

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

QWidget * __thiscall QFormLayout::labelForField(QFormLayout *this,QWidget *field)

{
  long lVar1;
  QFormLayoutPrivate *this_00;
  int *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutItem *label;
  QFormLayoutPrivate *d;
  ItemRole role;
  int row;
  ItemRole *in_stack_ffffffffffffffb8;
  QWidget *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFormLayout *)0x4b802f);
  getWidgetPosition((QFormLayout *)this_00,in_stack_ffffffffffffffc8,in_RDI,
                    in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QFormLayout::labelForField(QWidget *field) const
{
    Q_D(const QFormLayout);

    int row;
    ItemRole role = LabelRole;

    getWidgetPosition(field, &row, &role);

    if (row != -1 && role == FieldRole) {
        if (QFormLayoutItem *label = d->m_matrix(row, LabelRole))
            return label->widget();
    }
    return nullptr;
}